

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter_avx2.c
# Opt level: O0

double av1_estimate_noise_from_single_plane_avx2
                 (uint8_t *src,int height,int width,int stride,int edge_thresh)

{
  undefined1 (*pauVar1) [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  undefined1 (*pauVar19) [32];
  undefined1 (*pauVar20) [32];
  undefined8 *puVar21;
  undefined1 (*pauVar22) [32];
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  __m128i result;
  __m128i sum_avx_1;
  __m128i sum_avx_hi;
  __m128i sum_avx_lo;
  __m256i sum_avx;
  int v;
  int ga;
  int g_y;
  int g_x;
  int k_1;
  int w_1;
  int h_1;
  __m256i num_1;
  __m256i num_0;
  __m256i var_hi;
  __m256i var_lo;
  __m256i var_hi_0;
  __m256i var_lo_0;
  __m256i E_hi;
  __m256i E_lo;
  __m256i sum_ACGI_hi;
  __m256i sum_DFBH_hi;
  __m256i sum_ACGI_lo;
  __m256i sum_DFBH_lo;
  __m256i sum_BH_hi;
  __m256i sum_BH_lo;
  __m256i comp_reg;
  __m256i cmp_hi;
  __m256i cmp_lo;
  __m256i ga_hi;
  __m256i ga_lo;
  __m256i sub_BH_hi;
  __m256i sub_BH_lo;
  __m256i H_hi;
  __m256i H_lo;
  __m256i I_hi;
  __m256i I_lo;
  __m256i G_hi;
  __m256i G_lo;
  __m256i B_hi;
  __m256i B_lo;
  __m256i I;
  __m256i H;
  __m256i G;
  int k;
  __m256i gy_hi;
  __m256i gx_hi;
  __m256i gy_lo;
  __m256i gx_lo;
  __m256i sub_GI_hi;
  __m256i sum_GI_hi;
  __m256i sub_GI_lo;
  __m256i sum_GI_lo;
  __m256i sum_DF_hi;
  __m256i sum_DF_lo;
  __m256i sub_DF_hi;
  __m256i sub_DF_lo;
  __m256i sum_AC_hi;
  __m256i sum_AC_lo;
  __m256i sub_AC_hi;
  __m256i sub_AC_lo;
  __m256i F_hi;
  __m256i F_lo;
  __m256i D_hi;
  __m256i D_lo;
  __m256i C_hi;
  __m256i C_lo;
  __m256i A_hi;
  __m256i A_lo;
  __m256i E;
  __m256i B;
  __m256i F;
  __m256i D;
  __m256i C;
  __m256i A;
  __m256i num_accum_row_lvl;
  int stride_0;
  int start_idx;
  int h;
  int w;
  __m256i sum_accumulator;
  __m256i num_accumulator;
  __m256i edge_threshold;
  __m256i zero;
  int w32;
  int64_t accum;
  int count;
  double local_2050;
  int iStack_2038;
  uint local_1fc8;
  int local_1fc4;
  long lStack_1de8;
  undefined1 local_1aa0 [32];
  undefined1 local_1a80 [32];
  undefined1 local_1a60 [32];
  undefined1 local_1a40 [32];
  undefined1 local_1a20 [32];
  undefined1 local_1a00 [32];
  undefined1 local_19e0 [32];
  undefined1 local_19c0 [32];
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined1 local_17e0 [32];
  int local_17a8;
  int local_17a4;
  undefined1 local_17a0 [32];
  undefined1 local_1780 [32];
  long local_1708;
  int local_16fc;
  ushort local_16f8;
  int local_a0;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  local_16fc = 0;
  local_1708 = 0;
  uVar15 = in_EDX - 1U & 0xffffffe0;
  local_16f8 = (ushort)in_R8D;
  auVar24 = vpinsrw_avx(ZEXT216(local_16f8),in_R8D & 0xffff,1);
  auVar24 = vpinsrw_avx(auVar24,in_R8D & 0xffff,2);
  auVar24 = vpinsrw_avx(auVar24,in_R8D & 0xffff,3);
  auVar24 = vpinsrw_avx(auVar24,in_R8D & 0xffff,4);
  auVar24 = vpinsrw_avx(auVar24,in_R8D & 0xffff,5);
  auVar24 = vpinsrw_avx(auVar24,in_R8D & 0xffff,6);
  auVar24 = vpinsrw_avx(auVar24,in_R8D & 0xffff,7);
  auVar23 = vpinsrw_avx(ZEXT216(local_16f8),in_R8D & 0xffff,1);
  auVar23 = vpinsrw_avx(auVar23,in_R8D & 0xffff,2);
  auVar23 = vpinsrw_avx(auVar23,in_R8D & 0xffff,3);
  auVar23 = vpinsrw_avx(auVar23,in_R8D & 0xffff,4);
  auVar23 = vpinsrw_avx(auVar23,in_R8D & 0xffff,5);
  auVar23 = vpinsrw_avx(auVar23,in_R8D & 0xffff,6);
  auVar23 = vpinsrw_avx(auVar23,in_R8D & 0xffff,7);
  auVar23 = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar23;
  auVar24 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar24;
  uStack_70 = auVar24._0_8_;
  uStack_68 = auVar24._8_8_;
  local_1780 = ZEXT1632(ZEXT816(0));
  local_17a0 = ZEXT1632(ZEXT816(0));
  for (local_17a4 = 1; local_17a4 < (int)uVar15; local_17a4 = local_17a4 + 0x20) {
    local_17a8 = 1;
    iVar16 = in_ECX + local_17a4;
    iVar17 = iVar16 - in_ECX;
    local_17e0 = ZEXT1632(ZEXT816(0));
    pauVar19 = (undefined1 (*) [32])(in_RDI + (iVar17 + -1));
    pauVar1 = (undefined1 (*) [32])((long)iVar17 + 1 + in_RDI);
    pauVar20 = (undefined1 (*) [32])(in_RDI + (iVar16 + -1));
    pauVar22 = (undefined1 (*) [32])((long)iVar16 + 1 + in_RDI);
    puVar21 = (undefined8 *)(in_RDI + iVar17);
    local_1880 = *puVar21;
    uStack_1878 = puVar21[1];
    uStack_1870 = puVar21[2];
    uStack_1868 = puVar21[3];
    puVar21 = (undefined8 *)(in_RDI + iVar16);
    auVar9 = vpunpcklbw_avx2(*pauVar19,ZEXT1632(ZEXT816(0)));
    auVar3 = vpunpckhbw_avx2(*pauVar19,ZEXT1632(ZEXT816(0)));
    auVar10 = vpunpcklbw_avx2(*pauVar1,ZEXT1632(ZEXT816(0)));
    auVar4 = vpunpckhbw_avx2(*pauVar1,ZEXT1632(ZEXT816(0)));
    auVar11 = vpunpcklbw_avx2(*pauVar20,ZEXT1632(ZEXT816(0)));
    auVar5 = vpunpckhbw_avx2(*pauVar20,ZEXT1632(ZEXT816(0)));
    auVar12 = vpunpcklbw_avx2(*pauVar22,ZEXT1632(ZEXT816(0)));
    auVar6 = vpunpckhbw_avx2(*pauVar22,ZEXT1632(ZEXT816(0)));
    local_19c0 = vpsubw_avx2(auVar9,auVar10);
    local_19e0 = vpsubw_avx2(auVar3,auVar4);
    local_1a00 = vpaddw_avx2(auVar9,auVar10);
    local_1a20 = vpaddw_avx2(auVar3,auVar4);
    local_1a40 = vpsubw_avx2(auVar11,auVar12);
    local_1a60 = vpsubw_avx2(auVar5,auVar6);
    local_1a80 = vpaddw_avx2(auVar11,auVar12);
    local_1aa0 = vpaddw_avx2(auVar5,auVar6);
    local_18a0 = *puVar21;
    uStack_1898 = puVar21[1];
    uStack_1890 = puVar21[2];
    uStack_1888 = puVar21[3];
    for (; local_17a8 < in_ESI + -1; local_17a8 = local_17a8 + 1) {
      iVar16 = local_17a8 * in_ECX + local_17a4;
      pauVar22 = (undefined1 (*) [32])(in_RDI + (iVar16 + -1 + in_ECX));
      pauVar19 = (undefined1 (*) [32])(in_RDI + (iVar16 + in_ECX));
      pauVar1 = (undefined1 (*) [32])((long)(iVar16 + in_ECX) + 1 + in_RDI);
      auVar3._8_8_ = uStack_1878;
      auVar3._0_8_ = local_1880;
      auVar3._16_8_ = uStack_1870;
      auVar3._24_8_ = uStack_1868;
      auVar13 = vpunpcklbw_avx2(auVar3,ZEXT1632(ZEXT816(0)));
      auVar4._8_8_ = uStack_1878;
      auVar4._0_8_ = local_1880;
      auVar4._16_8_ = uStack_1870;
      auVar4._24_8_ = uStack_1868;
      auVar7 = vpunpckhbw_avx2(auVar4,ZEXT1632(ZEXT816(0)));
      auVar5 = vpunpcklbw_avx2(*pauVar22,ZEXT1632(ZEXT816(0)));
      auVar3 = vpunpckhbw_avx2(*pauVar22,ZEXT1632(ZEXT816(0)));
      auVar6 = vpunpcklbw_avx2(*pauVar1,ZEXT1632(ZEXT816(0)));
      auVar4 = vpunpckhbw_avx2(*pauVar1,ZEXT1632(ZEXT816(0)));
      auVar14 = vpunpcklbw_avx2(*pauVar19,ZEXT1632(ZEXT816(0)));
      auVar8 = vpunpckhbw_avx2(*pauVar19,ZEXT1632(ZEXT816(0)));
      auVar10 = vpsubw_avx2(auVar5,auVar6);
      auVar11 = vpsubw_avx2(auVar3,auVar4);
      auVar5 = vpaddw_avx2(auVar5,auVar6);
      auVar6 = vpaddw_avx2(auVar3,auVar4);
      auVar9 = vpsubw_avx2(auVar13,auVar14);
      auVar12 = vpsubw_avx2(auVar7,auVar8);
      auVar3 = vpaddw_avx2(local_19c0,auVar10);
      auVar4 = vpsllw_avx2(local_1a40,ZEXT416(1));
      auVar3 = vpaddw_avx2(auVar3,auVar4);
      auVar3 = vpabsw_avx2(auVar3);
      auVar2 = vpsubw_avx2(local_1a00,auVar5);
      auVar4 = vpsllw_avx2(auVar9,ZEXT416(1));
      auVar4 = vpaddw_avx2(auVar2,auVar4);
      auVar4 = vpabsw_avx2(auVar4);
      auVar9 = vpaddw_avx2(auVar3,auVar4);
      auVar3 = vpaddw_avx2(local_19e0,auVar11);
      auVar4 = vpsllw_avx2(local_1a60,ZEXT416(1));
      auVar3 = vpaddw_avx2(auVar3,auVar4);
      auVar3 = vpabsw_avx2(auVar3);
      auVar2 = vpsubw_avx2(local_1a20,auVar6);
      auVar4 = vpsllw_avx2(auVar12,ZEXT416(1));
      auVar4 = vpaddw_avx2(auVar2,auVar4);
      auVar4 = vpabsw_avx2(auVar4);
      auVar3 = vpaddw_avx2(auVar3,auVar4);
      auVar12._16_8_ = uStack_70;
      auVar12._0_16_ = auVar23;
      auVar12._24_8_ = uStack_68;
      auVar4 = vpcmpgtw_avx2(auVar12,auVar9);
      auVar9._16_8_ = uStack_70;
      auVar9._0_16_ = auVar23;
      auVar9._24_8_ = uStack_68;
      auVar9 = vpcmpgtw_avx2(auVar9,auVar3);
      auVar3 = vpaddw_avx2(auVar4,auVar9);
      lStack_1de8 = auVar3._24_8_;
      if ((((((((((((((((((((((((((((((((auVar3 >> 7 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar3 >> 0xf & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar3 >> 0x17 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar3 >> 0x1f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar3 >> 0x27 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar3 >> 0x2f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                   ) || (auVar3 >> 0x37 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                 (auVar3 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                                || (auVar3 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || (auVar3 >> 0x4f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                              (auVar3 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                             (auVar3 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar3 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (auVar3 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar3 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar3 >> 0x7f,0) != '\0') ||
                        (auVar3 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar3 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar3 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar3 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar3 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (auVar3 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar3 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar3 >> 0xbf,0) != '\0') ||
                (auVar3 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar3 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar3 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar3 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar3 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           (auVar3 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar3 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) || lStack_1de8 < 0) {
        auVar3 = vpaddw_avx2(auVar13,auVar14);
        auVar12 = vpaddw_avx2(auVar7,auVar8);
        auVar3 = vpaddw_avx2(local_1a80,auVar3);
        auVar2 = vpsllw_avx2(auVar3,ZEXT416(1));
        auVar3 = vpaddw_avx2(local_1a00,auVar5);
        auVar12 = vpaddw_avx2(local_1aa0,auVar12);
        auVar7 = vpsllw_avx2(auVar12,ZEXT416(1));
        auVar12 = vpaddw_avx2(local_1a20,auVar6);
        auVar8._8_8_ = uStack_1898;
        auVar8._0_8_ = local_18a0;
        auVar8._16_8_ = uStack_1890;
        auVar8._24_8_ = uStack_1888;
        auVar8 = vpunpcklbw_avx2(auVar8,ZEXT1632(ZEXT816(0)));
        auVar13._8_8_ = uStack_1898;
        auVar13._0_8_ = local_18a0;
        auVar13._16_8_ = uStack_1890;
        auVar13._24_8_ = uStack_1888;
        auVar13 = vpunpckhbw_avx2(auVar13,ZEXT1632(ZEXT816(0)));
        auVar8 = vpsllw_avx2(auVar8,ZEXT416(2));
        auVar2 = vpsubw_avx2(auVar8,auVar2);
        auVar3 = vpaddw_avx2(auVar2,auVar3);
        auVar3 = vpabsw_avx2(auVar3);
        auVar2 = vpsllw_avx2(auVar13,ZEXT416(2));
        auVar2 = vpsubw_avx2(auVar2,auVar7);
        auVar12 = vpaddw_avx2(auVar2,auVar12);
        auVar12 = vpabsw_avx2(auVar12);
        auVar2 = vpsrlw_avx2(auVar4,ZEXT416(0xf));
        auVar7 = vpsrlw_avx2(auVar9,ZEXT416(0xf));
        auVar4 = vpmullw_avx2(auVar3,auVar2);
        auVar9 = vpmullw_avx2(auVar12,auVar7);
        auVar3 = vpaddw_avx2(local_17e0,auVar2);
        local_17e0 = vpaddw_avx2(auVar3,auVar7);
        auVar3 = vpunpcklwd_avx2(auVar4,ZEXT1632(ZEXT816(0)));
        auVar3 = vpaddd_avx2(local_17a0,auVar3);
        auVar4 = vpunpckhwd_avx2(auVar4,ZEXT1632(ZEXT816(0)));
        auVar3 = vpaddd_avx2(auVar3,auVar4);
        auVar4 = vpunpcklwd_avx2(auVar9,ZEXT1632(ZEXT816(0)));
        auVar3 = vpaddd_avx2(auVar3,auVar4);
        auVar4 = vpunpckhwd_avx2(auVar9,ZEXT1632(ZEXT816(0)));
        local_17a0 = vpaddd_avx2(auVar3,auVar4);
      }
      local_19c0 = local_1a40;
      local_19e0 = local_1a60;
      local_1a00 = local_1a80;
      local_1a20 = local_1aa0;
      local_1880 = local_18a0;
      uStack_1878 = uStack_1898;
      uStack_1870 = uStack_1890;
      uStack_1868 = uStack_1888;
      local_1aa0 = auVar6;
      local_1a80 = auVar5;
      local_1a60 = auVar11;
      local_1a40 = auVar10;
      local_18a0 = *(undefined8 *)*pauVar19;
      uStack_1898 = *(undefined8 *)(*pauVar19 + 8);
      uStack_1890 = *(undefined8 *)(*pauVar19 + 0x10);
      uStack_1888 = *(undefined8 *)(*pauVar19 + 0x18);
    }
    auVar4 = vpunpcklwd_avx2(local_17e0,ZEXT1632(ZEXT816(0)));
    auVar3 = vpunpckhwd_avx2(local_17e0,ZEXT1632(ZEXT816(0)));
    auVar3 = vpaddd_avx2(auVar4,auVar3);
    local_1780 = vpaddd_avx2(local_1780,auVar3);
  }
  for (local_1fc4 = 1; local_1fc8 = uVar15, local_1fc4 < in_ESI + -1; local_1fc4 = local_1fc4 + 1) {
    while (local_1fc8 = local_1fc8 + 1, (int)local_1fc8 < in_EDX + -1) {
      iVar18 = local_1fc4 * in_ECX + local_1fc8;
      iVar16 = ((uint)*(byte *)(in_RDI + ((iVar18 - in_ECX) + -1)) -
               (uint)*(byte *)(in_RDI + ((iVar18 - in_ECX) + 1))) +
               ((uint)*(byte *)(in_RDI + (iVar18 + in_ECX + -1)) -
               (uint)*(byte *)(in_RDI + (iVar18 + in_ECX + 1))) +
               ((uint)*(byte *)(in_RDI + (iVar18 + -1)) - (uint)*(byte *)(in_RDI + (iVar18 + 1))) *
               2;
      iVar17 = ((uint)*(byte *)(in_RDI + ((iVar18 - in_ECX) + -1)) -
               (uint)*(byte *)(in_RDI + (iVar18 + in_ECX + -1))) +
               ((uint)*(byte *)(in_RDI + ((iVar18 - in_ECX) + 1)) -
               (uint)*(byte *)(in_RDI + (iVar18 + in_ECX + 1))) +
               ((uint)*(byte *)(in_RDI + (iVar18 - in_ECX)) -
               (uint)*(byte *)(in_RDI + (iVar18 + in_ECX))) * 2;
      if (iVar16 < 1) {
        iVar16 = -iVar16;
      }
      if (iVar17 < 1) {
        iVar17 = -iVar17;
      }
      if (iVar16 + iVar17 < (int)in_R8D) {
        iVar16 = (uint)*(byte *)(in_RDI + iVar18) * 4 +
                 ((uint)*(byte *)(in_RDI + (iVar18 + -1)) + (uint)*(byte *)(in_RDI + (iVar18 + 1)) +
                  (uint)*(byte *)(in_RDI + (iVar18 - in_ECX)) +
                 (uint)*(byte *)(in_RDI + (iVar18 + in_ECX))) * -2 +
                 (uint)*(byte *)(in_RDI + ((iVar18 - in_ECX) + -1)) +
                 (uint)*(byte *)(in_RDI + ((iVar18 - in_ECX) + 1)) +
                 (uint)*(byte *)(in_RDI + (iVar18 + in_ECX + -1)) +
                 (uint)*(byte *)(in_RDI + (iVar18 + in_ECX + 1));
        if (iVar16 < 1) {
          iVar16 = -iVar16;
        }
        local_1708 = iVar16 + local_1708;
        local_16fc = local_16fc + 1;
      }
    }
  }
  auVar3 = vphaddd_avx2(local_17a0,local_1780);
  auVar24 = vpaddd_avx(auVar3._0_16_,auVar3._16_16_);
  auVar23 = vpsrldq_avx(auVar24,4);
  auVar24 = vpaddd_avx(auVar23,auVar24);
  local_a0 = auVar24._0_4_;
  iStack_2038 = auVar24._8_4_;
  if (iStack_2038 + local_16fc < 0x10) {
    local_2050 = -1.0;
  }
  else {
    local_2050 = ((double)(local_1708 + local_a0) / (double)((iStack_2038 + local_16fc) * 6)) *
                 1.25331413732;
  }
  return local_2050;
}

Assistant:

double av1_estimate_noise_from_single_plane_avx2(const uint8_t *src, int height,
                                                 int width, int stride,
                                                 int edge_thresh) {
  int count = 0;
  int64_t accum = 0;
  // w32 stores width multiple of 32.
  const int w32 = (width - 1) & ~0x1f;
  const __m256i zero = _mm256_setzero_si256();
  const __m256i edge_threshold = _mm256_set1_epi16(edge_thresh);
  __m256i num_accumulator = zero;
  __m256i sum_accumulator = zero;

  //  A | B | C
  //  D | E | F
  //  G | H | I
  // g_x = (A - C) + (G - I) + 2*(D - F)
  // g_y = (A + C) - (G + I) + 2*(B - H)
  // v   = 4*E - 2*(D+F+B+H) + (A+C+G+I)

  // Process the width multiple of 32 here.
  for (int w = 1; w < w32; w += 32) {
    int h = 1;
    const int start_idx = h * stride + w;
    const int stride_0 = start_idx - stride;

    __m256i num_accum_row_lvl = zero;
    const __m256i A = _mm256_loadu_si256((__m256i *)(&src[stride_0 - 1]));
    const __m256i C = _mm256_loadu_si256((__m256i *)(&src[stride_0 + 1]));
    const __m256i D = _mm256_loadu_si256((__m256i *)(&src[start_idx - 1]));
    const __m256i F = _mm256_loadu_si256((__m256i *)(&src[start_idx + 1]));
    __m256i B = _mm256_loadu_si256((__m256i *)(&src[stride_0]));
    __m256i E = _mm256_loadu_si256((__m256i *)(&src[start_idx]));

    const __m256i A_lo = _mm256_unpacklo_epi8(A, zero);
    const __m256i A_hi = _mm256_unpackhi_epi8(A, zero);
    const __m256i C_lo = _mm256_unpacklo_epi8(C, zero);
    const __m256i C_hi = _mm256_unpackhi_epi8(C, zero);
    const __m256i D_lo = _mm256_unpacklo_epi8(D, zero);
    const __m256i D_hi = _mm256_unpackhi_epi8(D, zero);
    const __m256i F_lo = _mm256_unpacklo_epi8(F, zero);
    const __m256i F_hi = _mm256_unpackhi_epi8(F, zero);

    __m256i sub_AC_lo = _mm256_sub_epi16(A_lo, C_lo);
    __m256i sub_AC_hi = _mm256_sub_epi16(A_hi, C_hi);
    __m256i sum_AC_lo = _mm256_add_epi16(A_lo, C_lo);
    __m256i sum_AC_hi = _mm256_add_epi16(A_hi, C_hi);
    __m256i sub_DF_lo = _mm256_sub_epi16(D_lo, F_lo);
    __m256i sub_DF_hi = _mm256_sub_epi16(D_hi, F_hi);
    __m256i sum_DF_lo = _mm256_add_epi16(D_lo, F_lo);
    __m256i sum_DF_hi = _mm256_add_epi16(D_hi, F_hi);

    for (; h < height - 1; h++) {
      __m256i sum_GI_lo, sub_GI_lo, sum_GI_hi, sub_GI_hi, gx_lo, gy_lo, gx_hi,
          gy_hi;
      const int k = h * stride + w;
      const __m256i G = _mm256_loadu_si256((__m256i *)(&src[k + stride - 1]));
      const __m256i H = _mm256_loadu_si256((__m256i *)(&src[k + stride]));
      const __m256i I = _mm256_loadu_si256((__m256i *)(&src[k + stride + 1]));

      const __m256i B_lo = _mm256_unpacklo_epi8(B, zero);
      const __m256i B_hi = _mm256_unpackhi_epi8(B, zero);
      const __m256i G_lo = _mm256_unpacklo_epi8(G, zero);
      const __m256i G_hi = _mm256_unpackhi_epi8(G, zero);
      const __m256i I_lo = _mm256_unpacklo_epi8(I, zero);
      const __m256i I_hi = _mm256_unpackhi_epi8(I, zero);
      const __m256i H_lo = _mm256_unpacklo_epi8(H, zero);
      const __m256i H_hi = _mm256_unpackhi_epi8(H, zero);

      sub_GI_lo = _mm256_sub_epi16(G_lo, I_lo);
      sub_GI_hi = _mm256_sub_epi16(G_hi, I_hi);
      sum_GI_lo = _mm256_add_epi16(G_lo, I_lo);
      sum_GI_hi = _mm256_add_epi16(G_hi, I_hi);
      const __m256i sub_BH_lo = _mm256_sub_epi16(B_lo, H_lo);
      const __m256i sub_BH_hi = _mm256_sub_epi16(B_hi, H_hi);

      CALC_X_GRADIENT(sub_AC_lo, sub_GI_lo, sub_DF_lo, gx_lo)
      CALC_Y_GRADIENT(sum_AC_lo, sum_GI_lo, sub_BH_lo, gy_lo)

      const __m256i ga_lo = _mm256_add_epi16(gx_lo, gy_lo);

      CALC_X_GRADIENT(sub_AC_hi, sub_GI_hi, sub_DF_hi, gx_hi)
      CALC_Y_GRADIENT(sum_AC_hi, sum_GI_hi, sub_BH_hi, gy_hi)

      const __m256i ga_hi = _mm256_add_epi16(gx_hi, gy_hi);

      __m256i cmp_lo = _mm256_cmpgt_epi16(edge_threshold, ga_lo);
      __m256i cmp_hi = _mm256_cmpgt_epi16(edge_threshold, ga_hi);
      const __m256i comp_reg = _mm256_add_epi16(cmp_lo, cmp_hi);

      // v = 4*E -2*(D+F+B+H) + (A+C+G+I)
      if (_mm256_movemask_epi8(comp_reg) != 0) {
        const __m256i sum_BH_lo = _mm256_add_epi16(B_lo, H_lo);
        const __m256i sum_BH_hi = _mm256_add_epi16(B_hi, H_hi);

        // 2*(D+F+B+H)
        const __m256i sum_DFBH_lo =
            _mm256_slli_epi16(_mm256_add_epi16(sum_DF_lo, sum_BH_lo), 1);
        // (A+C+G+I)
        const __m256i sum_ACGI_lo = _mm256_add_epi16(sum_AC_lo, sum_GI_lo);
        const __m256i sum_DFBH_hi =
            _mm256_slli_epi16(_mm256_add_epi16(sum_DF_hi, sum_BH_hi), 1);
        const __m256i sum_ACGI_hi = _mm256_add_epi16(sum_AC_hi, sum_GI_hi);

        // Convert E register values from 8bit to 16bit
        const __m256i E_lo = _mm256_unpacklo_epi8(E, zero);
        const __m256i E_hi = _mm256_unpackhi_epi8(E, zero);

        // 4*E - 2*(D+F+B+H)+ (A+C+G+I)
        const __m256i var_lo_0 = _mm256_abs_epi16(_mm256_add_epi16(
            _mm256_sub_epi16(_mm256_slli_epi16(E_lo, 2), sum_DFBH_lo),
            sum_ACGI_lo));
        const __m256i var_hi_0 = _mm256_abs_epi16(_mm256_add_epi16(
            _mm256_sub_epi16(_mm256_slli_epi16(E_hi, 2), sum_DFBH_hi),
            sum_ACGI_hi));
        cmp_lo = _mm256_srli_epi16(cmp_lo, 15);
        cmp_hi = _mm256_srli_epi16(cmp_hi, 15);
        const __m256i var_lo = _mm256_mullo_epi16(var_lo_0, cmp_lo);
        const __m256i var_hi = _mm256_mullo_epi16(var_hi_0, cmp_hi);

        num_accum_row_lvl = _mm256_add_epi16(num_accum_row_lvl, cmp_lo);
        num_accum_row_lvl = _mm256_add_epi16(num_accum_row_lvl, cmp_hi);

        sum_accumulator = _mm256_add_epi32(sum_accumulator,
                                           _mm256_unpacklo_epi16(var_lo, zero));
        sum_accumulator = _mm256_add_epi32(sum_accumulator,
                                           _mm256_unpackhi_epi16(var_lo, zero));
        sum_accumulator = _mm256_add_epi32(sum_accumulator,
                                           _mm256_unpacklo_epi16(var_hi, zero));
        sum_accumulator = _mm256_add_epi32(sum_accumulator,
                                           _mm256_unpackhi_epi16(var_hi, zero));
      }
      sub_AC_lo = sub_DF_lo;
      sub_AC_hi = sub_DF_hi;
      sub_DF_lo = sub_GI_lo;
      sub_DF_hi = sub_GI_hi;
      sum_AC_lo = sum_DF_lo;
      sum_AC_hi = sum_DF_hi;
      sum_DF_lo = sum_GI_lo;
      sum_DF_hi = sum_GI_hi;
      B = E;
      E = H;
    }
    const __m256i num_0 = _mm256_unpacklo_epi16(num_accum_row_lvl, zero);
    const __m256i num_1 = _mm256_unpackhi_epi16(num_accum_row_lvl, zero);
    num_accumulator =
        _mm256_add_epi32(num_accumulator, _mm256_add_epi32(num_0, num_1));
  }

  // Process the remaining width here.
  for (int h = 1; h < height - 1; ++h) {
    for (int w = w32 + 1; w < width - 1; ++w) {
      const int k = h * stride + w;

      // Compute sobel gradients
      const int g_x = (src[k - stride - 1] - src[k - stride + 1]) +
                      (src[k + stride - 1] - src[k + stride + 1]) +
                      2 * (src[k - 1] - src[k + 1]);
      const int g_y = (src[k - stride - 1] - src[k + stride - 1]) +
                      (src[k - stride + 1] - src[k + stride + 1]) +
                      2 * (src[k - stride] - src[k + stride]);
      const int ga = abs(g_x) + abs(g_y);

      if (ga < edge_thresh) {
        // Find Laplacian
        const int v =
            4 * src[k] -
            2 * (src[k - 1] + src[k + 1] + src[k - stride] + src[k + stride]) +
            (src[k - stride - 1] + src[k - stride + 1] + src[k + stride - 1] +
             src[k + stride + 1]);
        accum += abs(v);
        ++count;
      }
    }
  }

  // s0 s1 n0 n1 s2 s3 n2 n3
  __m256i sum_avx = _mm256_hadd_epi32(sum_accumulator, num_accumulator);
  __m128i sum_avx_lo = _mm256_castsi256_si128(sum_avx);
  __m128i sum_avx_hi = _mm256_extractf128_si256(sum_avx, 1);
  // s0+s2 s1+s3 n0+n2 n1+n3
  __m128i sum_avx_1 = _mm_add_epi32(sum_avx_lo, sum_avx_hi);
  // s0+s2+s1+s3 n0+n2+n1+n3
  __m128i result = _mm_add_epi32(_mm_srli_si128(sum_avx_1, 4), sum_avx_1);

  accum += _mm_cvtsi128_si32(result);
  count += _mm_extract_epi32(result, 2);

  // If very few smooth pels, return -1 since the estimate is unreliable.
  return (count < 16) ? -1.0 : (double)accum / (6 * count) * SQRT_PI_BY_2;
}